

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall HighsDomain::markPropagateCut(HighsDomain *this,Reason reason)

{
  size_type sVar1;
  ConflictPoolPropagation *this_00;
  int in_ESI;
  undefined4 in_stack_ffffffffffffffc8;
  HighsInt in_stack_ffffffffffffffcc;
  deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
  *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  HighsInt cut;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  cut = (HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if (6 < in_ESI + 7U) {
    iVar2 = in_ESI;
    sVar1 = std::
            deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
            ::size((deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                    *)0x5c6794);
    if (iVar2 < (int)sVar1) {
      std::deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
      ::operator[](in_stack_ffffffffffffffd0,
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      CutpoolPropagation::markPropagateCut
                ((CutpoolPropagation *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),cut);
    }
    else {
      this_00 = (ConflictPoolPropagation *)(long)in_ESI;
      std::deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
      ::size((deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
              *)0x5c67ec);
      std::
      deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
      ::operator[]((deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
                    *)this_00,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      ConflictPoolPropagation::markPropagateConflict(this_00,in_stack_ffffffffffffffcc);
    }
  }
  return;
}

Assistant:

void HighsDomain::markPropagateCut(Reason reason) {
  switch (reason.type) {
    case Reason::kUnknown:
    case Reason::kCliqueTable:
    case Reason::kBranching:
    case Reason::kModelRowLower:
    case Reason::kModelRowUpper:
    case Reason::kConflictingBounds:
    case Reason::kObjective:
      break;
    default:
      assert(reason.type >= 0 &&
             reason.type < HighsInt(cutpoolpropagation.size() +
                                    conflictPoolPropagation.size()));
      if (reason.type < (HighsInt)cutpoolpropagation.size())
        cutpoolpropagation[reason.type].markPropagateCut(reason.index);
      else
        conflictPoolPropagation[reason.type - cutpoolpropagation.size()]
            .markPropagateConflict(reason.index);
  }
}